

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O2

int CorrelationMeter::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float sample;
  EffectData *pEVar1;
  ulong uVar2;
  ulong uVar3;
  HistoryBuffer *this;
  uint uVar4;
  bool bVar5;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<CorrelationMeter::EffectData>(state);
  memcpy(outbuffer,inbuffer,(ulong)length * (long)inchannels * 4);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < inchannels) {
    uVar3 = (ulong)(uint)inchannels;
    uVar4 = 0;
  }
  for (; uVar2 = uVar3, this = (HistoryBuffer *)&pEVar1->field_0x8, uVar4 != length;
      uVar4 = uVar4 + 1) {
    while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
      sample = *inbuffer;
      inbuffer = inbuffer + 1;
      HistoryBuffer::Feed(this,sample);
      this = this + 1;
    }
  }
  pEVar1->numchannels = inchannels;
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);

        for (unsigned int n = 0; n < length; n++)
            for (int i = 0; i < inchannels; i++)
                data->history[i].Feed(*inbuffer++);
        data->numchannels = inchannels;

        return UNITY_AUDIODSP_OK;
    }